

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVGPainter.cpp
# Opt level: O3

void __thiscall
SVGChart::SVGPainter::DrawRotatedText
          (SVGPainter *this,int inX,int inY,float inDegrees,char *inString)

{
  ostream *poVar1;
  size_t sVar2;
  undefined1 *this_00;
  
  this_00 = &this->field_0x38;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"<text x=\"",9);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)this_00,inX);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\" y=\"",5);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,inY);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\" transform=",0xc);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\"rotate(",8);
  std::ostream::_M_insert<double>((double)inDegrees);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,",",1);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)this_00,inX);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,inY);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")\">",3);
  if (inString == (char *)0x0) {
    std::ios::clear((int)this_00 + (int)*(undefined8 *)(*(long *)this_00 + -0x18));
  }
  else {
    sVar2 = strlen(inString);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,inString,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"</text>\n",8);
  return;
}

Assistant:

void SVGPainter::DrawRotatedText (int inX, int inY, float inDegrees, const char *inString) {
        svgContent << "<text x=\"" << inX << "\" y=\"" << inY << "\" transform=";
        svgContent << "\"rotate(" << inDegrees;
        svgContent << "," << inX << "," << inY << ")\">";
        svgContent << inString << "</text>\n";
    }